

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O0

void __thiscall priority_deque_emplace::test_method(priority_deque_emplace *this)

{
  unit_test_log_t *this_00;
  bool bVar1;
  lazy_ostream *prev;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_110;
  multiset<int,_std::less<int>,_std::allocator<int>_> local_f0;
  undefined1 local_bb;
  bool local_ba;
  value_expr<bool> local_b9;
  assertion_result local_b8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  _Base_ptr local_80;
  int local_68;
  int local_64;
  int newval;
  int i;
  multiset<int,_std::less<int>,_std::allocator<int>_> existing_elements;
  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> pd;
  priority_deque_emplace *this_local;
  
  boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::
  priority_deque((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)
                 &existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&newval);
  for (local_64 = 0; local_64 < 0x200; local_64 = local_64 + 1) {
    local_68 = rand();
    local_80 = (_Base_ptr)
               std::multiset<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&newval,&local_68);
    boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>::
    emplace<int&>((priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>> *)
                  &existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_68);
  }
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_90,0x147,&local_a0);
    std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
              (&local_f0,(multiset<int,_std::less<int>,_std::allocator<int>_> *)&newval);
    local_bb = (anonymous_namespace)::
               have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
                         ((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
                           *)&existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_f0);
    boost::test_tools::assertion::seed::operator->*((seed *)&local_b9,&local_ba);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_b8,&local_b9,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,"have_same_elements(pd, std::move(existing_elements))",0x34);
    boost::unit_test::operator<<(&local_110,prev,&local_120);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion
              (&local_b8,&local_110.super_lazy_ostream,&local_130,0x147,REQUIRE,
               CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_110);
    boost::test_tools::assertion_result::~assertion_result(&local_b8);
    std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset(&local_f0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&newval);
  boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::
  ~priority_deque((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)
                  &existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( priority_deque_emplace )
{
  using namespace boost::container;

  priority_deque<int> pd;
  std::multiset<int> existing_elements;
  for (int i = 0; i < 512; ++i)
  {
    int newval = rand();
    existing_elements.insert(newval);
    pd.emplace(newval);
  }

  BOOST_TEST_REQUIRE(have_same_elements(pd, std::move(existing_elements)));
}